

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O2

bool __thiscall cmParseMumpsCoverage::LoadPackages(cmParseMumpsCoverage *this,char *d)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  mapped_type *pmVar2;
  pointer filename;
  string pat;
  string name;
  Glob glob;
  string sStack_e8;
  string local_c8;
  key_type local_a8;
  Glob local_88;
  
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = true;
  std::__cxx11::string::string((string *)&sStack_e8,d,(allocator *)&local_c8);
  std::__cxx11::string::append((char *)&sStack_e8);
  cmsys::Glob::FindFiles(&local_88,&sStack_e8,(GlobMessages *)0x0);
  pvVar1 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
  for (filename = (pvVar1->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      filename !=
      (pvVar1->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; filename = filename + 1) {
    cmsys::SystemTools::GetFilenameName(&local_c8,filename);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_c8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->RoutineToDirectory,&local_a8);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    InitializeMumpsFile(this,filename);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::__cxx11::string::~string((string *)&sStack_e8);
  cmsys::Glob::~Glob(&local_88);
  return true;
}

Assistant:

bool cmParseMumpsCoverage::LoadPackages(const char* d)
{
  cmsys::Glob glob;
  glob.RecurseOn();
  std::string pat = d;
  pat += "/*.m";
  glob.FindFiles(pat);
  std::vector<std::string>& files = glob.GetFiles();
  std::vector<std::string>::iterator fileIt;
  for (fileIt = files.begin(); fileIt != files.end(); ++fileIt) {
    std::string name = cmSystemTools::GetFilenameName(*fileIt);
    this->RoutineToDirectory[name.substr(0, name.size() - 2)] = *fileIt;
    // initialze each file, this is left out until CDash is fixed
    // to handle large numbers of files
    this->InitializeMumpsFile(*fileIt);
  }
  return true;
}